

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

int Gia_ManFindDivGateInt
              (word *pOff,word *pOn,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t *vUnateLits,
              Vec_Int_t *vUnatePairs,Vec_Int_t *vUnateLitsW,Vec_Int_t *vUnatePairsW,word *pDivTemp)

{
  int iVar1;
  int Lit;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  word *pOn_00;
  int i;
  
  iVar1 = Abc_TtCountOnesVec(pOn,nWords);
  i = 0;
  do {
    if (vUnateLits->nSize <= i) {
      return -1;
    }
    Lit = Vec_IntEntry(vUnateLits,i);
    iVar2 = Vec_IntEntry(vUnateLitsW,i);
    iVar3 = Abc_Lit2Var(Lit);
    pOn_00 = (word *)Vec_PtrEntry(vDivs,iVar3);
    if (iVar2 * 2 < iVar1) {
      return -1;
    }
    for (iVar3 = 0; iVar3 < vUnatePairs->nSize; iVar3 = iVar3 + 1) {
      iVar4 = Vec_IntEntry(vUnatePairs,iVar3);
      iVar5 = Vec_IntEntry(vUnatePairsW,iVar3);
      uVar6 = Abc_LitIsCompl(iVar4);
      if (iVar5 + iVar2 < iVar1) break;
      Gia_ManDeriveDivPair(iVar4,vDivs,nWords,pDivTemp);
      uVar7 = Abc_LitIsCompl(Lit);
      iVar4 = Gia_ManDivCover(pOn,pOn_00,(word *)(ulong)uVar7,(int)pDivTemp,(word *)(ulong)uVar6,
                              nWords,Lit);
      if (iVar4 != 0) {
        iVar1 = Abc_Var2Lit(iVar3,1);
        uVar6 = Abc_LitNot(Lit);
        iVar1 = Abc_Var2Lit(iVar1 << 0xf | uVar6,1);
        return iVar1;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Gia_ManFindDivGateInt( word * pOff, word * pOn, Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnateLits, Vec_Int_t * vUnatePairs, Vec_Int_t * vUnateLitsW, Vec_Int_t * vUnatePairsW, word * pDivTemp )
{
    int i, k, iDiv0, iDiv1, Cover0, Cover1;
    int nTotal = Abc_TtCountOnesVec( pOn, nWords );
    Vec_IntForEachEntryTwo( vUnateLits, vUnateLitsW, iDiv0, Cover0, i )
    {
        word * pDiv0 = (word *)Vec_PtrEntry(vDivs, Abc_Lit2Var(iDiv0));
        if ( 2*Cover0 < nTotal )
            break;
        Vec_IntForEachEntryTwo( vUnatePairs, vUnatePairsW, iDiv1, Cover1, k )
        {
            int fComp1 = Abc_LitIsCompl(iDiv1);
            if ( Cover0 + Cover1 < nTotal )
                break;
            Gia_ManDeriveDivPair( iDiv1, vDivs, nWords, pDivTemp );
            if ( Gia_ManDivCover(pOff, pOn, pDiv0, Abc_LitIsCompl(iDiv0), pDivTemp, fComp1, nWords) )
                return Abc_Var2Lit((Abc_Var2Lit(k, 1) << 15) | Abc_LitNot(iDiv0), 1);
        }
    }
    return -1;
}